

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

CURLcode dict_do(connectdata *conn,_Bool *done)

{
  curl_socket_t sockfd_00;
  Curl_easy *data_00;
  int iVar1;
  CURLcode CVar2;
  curl_off_t *bytecountp;
  char *pcVar3;
  int local_7c;
  int i;
  curl_off_t *bytecount;
  char *path;
  curl_socket_t sockfd;
  Curl_easy *data;
  CURLcode result;
  char *nthdef;
  char *strategy;
  char *database;
  char *ppath;
  char *eword;
  char *word;
  _Bool *done_local;
  connectdata *conn_local;
  
  strategy = (char *)0x0;
  nthdef = (char *)0x0;
  data_00 = conn->data;
  sockfd_00 = conn->sock[0];
  pcVar3 = (data_00->state).up.path;
  bytecountp = &(data_00->req).bytecount;
  *done = true;
  iVar1 = Curl_strncasecompare(pcVar3,"/MATCH:",7);
  if (((iVar1 == 0) && (iVar1 = Curl_strncasecompare(pcVar3,"/M:",3), iVar1 == 0)) &&
     (iVar1 = Curl_strncasecompare(pcVar3,"/FIND:",6), iVar1 == 0)) {
    iVar1 = Curl_strncasecompare(pcVar3,"/DEFINE:",8);
    if (((iVar1 == 0) && (iVar1 = Curl_strncasecompare(pcVar3,"/D:",3), iVar1 == 0)) &&
       (iVar1 = Curl_strncasecompare(pcVar3,"/LOOKUP:",8), iVar1 == 0)) {
      pcVar3 = strchr(pcVar3,0x2f);
      if (pcVar3 != (char *)0x0) {
        local_7c = 0;
        while (pcVar3[(long)local_7c + 1] != '\0') {
          if (pcVar3[(long)local_7c + 1] == ':') {
            pcVar3[(long)local_7c + 1] = ' ';
          }
          local_7c = local_7c + 1;
        }
        CVar2 = Curl_sendf(sockfd_00,conn,"CLIENT libcurl 7.64.0-DEV\r\n%s\r\nQUIT\r\n");
        if (CVar2 != CURLE_OK) {
          Curl_failf(data_00,"Failed sending DICT request");
          return CVar2;
        }
        Curl_setup_transfer(conn,0,-1,false,bytecountp,-1,(curl_off_t *)0x0);
      }
    }
    else {
      eword = strchr(pcVar3,0x3a);
      if (eword != (char *)0x0) {
        eword = eword + 1;
        pcVar3 = strchr(eword,0x3a);
        strategy = pcVar3;
        if (pcVar3 != (char *)0x0) {
          strategy = pcVar3 + 1;
          *pcVar3 = '\0';
          pcVar3 = strchr(strategy,0x3a);
          if (pcVar3 != (char *)0x0) {
            *pcVar3 = '\0';
          }
        }
      }
      if ((eword == (char *)0x0) || (*eword == '\0')) {
        Curl_infof(data_00,"lookup word is missing\n");
        eword = "default";
      }
      if ((strategy == (char *)0x0) || (*strategy == '\0')) {
        strategy = "!";
      }
      pcVar3 = unescape_word(data_00,eword);
      if (pcVar3 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      CVar2 = Curl_sendf(sockfd_00,conn,"CLIENT libcurl 7.64.0-DEV\r\nDEFINE %s %s\r\nQUIT\r\n",
                         strategy,pcVar3);
      (*Curl_cfree)(pcVar3);
      if (CVar2 != CURLE_OK) {
        Curl_failf(data_00,"Failed sending DICT request");
        return CVar2;
      }
      Curl_setup_transfer(conn,0,-1,false,bytecountp,-1,(curl_off_t *)0x0);
    }
  }
  else {
    eword = strchr(pcVar3,0x3a);
    if (eword != (char *)0x0) {
      eword = eword + 1;
      pcVar3 = strchr(eword,0x3a);
      strategy = pcVar3;
      if (pcVar3 != (char *)0x0) {
        strategy = pcVar3 + 1;
        *pcVar3 = '\0';
        pcVar3 = strchr(strategy,0x3a);
        nthdef = pcVar3;
        if (pcVar3 != (char *)0x0) {
          nthdef = pcVar3 + 1;
          *pcVar3 = '\0';
          pcVar3 = strchr(nthdef,0x3a);
          if (pcVar3 != (char *)0x0) {
            *pcVar3 = '\0';
          }
        }
      }
    }
    if ((eword == (char *)0x0) || (*eword == '\0')) {
      Curl_infof(data_00,"lookup word is missing\n");
      eword = "default";
    }
    if ((strategy == (char *)0x0) || (*strategy == '\0')) {
      strategy = "!";
    }
    if ((nthdef == (char *)0x0) || (*nthdef == '\0')) {
      nthdef = ".";
    }
    pcVar3 = unescape_word(data_00,eword);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = Curl_sendf(sockfd_00,conn,"CLIENT libcurl 7.64.0-DEV\r\nMATCH %s %s %s\r\nQUIT\r\n",
                       strategy,nthdef,pcVar3);
    (*Curl_cfree)(pcVar3);
    if (CVar2 != CURLE_OK) {
      Curl_failf(data_00,"Failed sending DICT request");
      return CVar2;
    }
    Curl_setup_transfer(conn,0,-1,false,bytecountp,-1,(curl_off_t *)0x0);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode dict_do(struct connectdata *conn, bool *done)
{
  char *word;
  char *eword;
  char *ppath;
  char *database = NULL;
  char *strategy = NULL;
  char *nthdef = NULL; /* This is not part of the protocol, but required
                          by RFC 2229 */
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  char *path = data->state.up.path;
  curl_off_t *bytecount = &data->req.bytecount;

  *done = TRUE; /* unconditionally */

  if(conn->bits.user_passwd) {
    /* AUTH is missing */
  }

  if(strncasecompare(path, DICT_MATCH, sizeof(DICT_MATCH)-1) ||
     strncasecompare(path, DICT_MATCH2, sizeof(DICT_MATCH2)-1) ||
     strncasecompare(path, DICT_MATCH3, sizeof(DICT_MATCH3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        strategy = strchr(database, ':');
        if(strategy) {
          *strategy++ = (char)0;
          nthdef = strchr(strategy, ':');
          if(nthdef) {
            *nthdef = (char)0;
          }
        }
      }
    }

    if((word == NULL) || (*word == (char)0)) {
      infof(data, "lookup word is missing\n");
      word = (char *)"default";
    }
    if((database == NULL) || (*database == (char)0)) {
      database = (char *)"!";
    }
    if((strategy == NULL) || (*strategy == (char)0)) {
      strategy = (char *)".";
    }

    eword = unescape_word(data, word);
    if(!eword)
      return CURLE_OUT_OF_MEMORY;

    result = Curl_sendf(sockfd, conn,
                        "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                        "MATCH "
                        "%s "    /* database */
                        "%s "    /* strategy */
                        "%s\r\n" /* word */
                        "QUIT\r\n",

                        database,
                        strategy,
                        eword
                        );

    free(eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      return result;
    }
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                        -1, NULL); /* no upload */
  }
  else if(strncasecompare(path, DICT_DEFINE, sizeof(DICT_DEFINE)-1) ||
          strncasecompare(path, DICT_DEFINE2, sizeof(DICT_DEFINE2)-1) ||
          strncasecompare(path, DICT_DEFINE3, sizeof(DICT_DEFINE3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        nthdef = strchr(database, ':');
        if(nthdef) {
          *nthdef = (char)0;
        }
      }
    }

    if((word == NULL) || (*word == (char)0)) {
      infof(data, "lookup word is missing\n");
      word = (char *)"default";
    }
    if((database == NULL) || (*database == (char)0)) {
      database = (char *)"!";
    }

    eword = unescape_word(data, word);
    if(!eword)
      return CURLE_OUT_OF_MEMORY;

    result = Curl_sendf(sockfd, conn,
                        "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                        "DEFINE "
                        "%s "     /* database */
                        "%s\r\n"  /* word */
                        "QUIT\r\n",
                        database,
                        eword);

    free(eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      return result;
    }
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                        -1, NULL); /* no upload */
  }
  else {

    ppath = strchr(path, '/');
    if(ppath) {
      int i;

      ppath++;
      for(i = 0; ppath[i]; i++) {
        if(ppath[i] == ':')
          ppath[i] = ' ';
      }
      result = Curl_sendf(sockfd, conn,
                          "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                          "%s\r\n"
                          "QUIT\r\n", ppath);
      if(result) {
        failf(data, "Failed sending DICT request");
        return result;
      }

      Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount, -1, NULL);
    }
  }

  return CURLE_OK;
}